

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_icy_carapace(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  bool fountain;
  bool puddle;
  AFFECT_DATA af;
  OBJ_DATA *obj;
  undefined6 in_stack_ffffffffffffff68;
  byte bVar2;
  byte bVar3;
  CHAR_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  OBJ_DATA *local_28;
  
  local_28 = (OBJ_DATA *)0x0;
  bVar3 = 0;
  bVar2 = 0;
  bVar1 = is_affected(in_RDX,(int)gsn_icy_carapace);
  if (bVar1) {
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    if ((in_RDX->in_room->sector_type != 6) && (in_RDX->in_room->sector_type != 8)) {
      for (local_28 = in_RDX->in_room->contents; local_28 != (OBJ_DATA *)0x0;
          local_28 = local_28->next_content) {
        if (local_28->item_type == 0x19) {
          bVar2 = 1;
        }
        if (local_28->pIndexData->vnum == 0xb78) {
          bVar3 = 1;
        }
      }
      if (((bVar3 & 1) == 0) && ((bVar2 & 1) == 0)) {
        send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        return;
      }
    }
    if ((bVar2 & 1) == 0) {
      if ((bVar3 & 1) == 0) {
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
      }
      else {
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
        act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
            (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
        if (local_28 != (OBJ_DATA *)0x0) {
          extract_obj((OBJ_DATA *)
                      CONCAT26(in_stack_ffffffffffffff96,
                               CONCAT24(in_stack_ffffffffffffff94,
                                        CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90
                                                ))));
        }
      }
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
          (void *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)),0);
    }
    init_affect((AFFECT_DATA *)0x6e686f);
    affect_to_char(in_stack_ffffffffffffff70,
                   (AFFECT_DATA *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)));
    affect_to_char(in_stack_ffffffffffffff70,
                   (AFFECT_DATA *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)));
    std::pow<int,int>(0,0x6e694f);
    affect_to_char(in_stack_ffffffffffffff70,
                   (AFFECT_DATA *)CONCAT17(bVar3,CONCAT16(bVar2,in_stack_ffffffffffffff68)));
  }
  return;
}

Assistant:

void spell_icy_carapace(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = nullptr;
	AFFECT_DATA af;
	bool puddle = false, fountain = false;

	if (is_affected(ch, gsn_icy_carapace))
	{
		send_to_char("You are already protected by an icy carapace.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type != SECT_WATER && ch->in_room->sector_type != SECT_UNDERWATER)
	{
		for (obj = ch->in_room->contents; obj; obj = obj->next_content)
		{
			if (obj->item_type == ITEM_FOUNTAIN)
				fountain = true;

			if (obj->pIndexData->vnum == OBJ_VNUM_PUDDLE)
				puddle = true;
		}

		if (!puddle && !fountain)
		{
			send_to_char("There is not enough water here to form an icy carapace.\n\r", ch);
			return;
		}
	}

	if (fountain)
	{
		act("Water flows up from $p, forming an icy carapace around you.", ch, obj, 0, TO_CHAR);
		act("Water flows up from $p, solidifying as ice around $n.", ch, obj, 0, TO_ROOM);
	}
	else if (puddle)
	{
		act("Water flows up from the puddle on the ground, forming an icy carapace around you.", ch, 0, 0, TO_CHAR);
		act("Water flows up from the puddle on the ground, solidifying as ice around $n.", ch, 0, 0, TO_ROOM);

		if (obj)
			extract_obj(obj);
	}
	else
	{
		act("A shell of water flows up around you and solidifies into an icy carapace.", ch, 0, 0, TO_CHAR);
		act("A shell of water flows up around $n and solidifies into an icy carapace.", ch, 0, 0, TO_ROOM);
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_icy_carapace;
	af.location = APPLY_AC;
	af.level = level;
	af.duration = (int)((float)level * 0.7);
	af.modifier = (int)((float)level * 0.82);
	af.owner = ch;
	affect_to_char(ch, &af);

	af.location = APPLY_DEX;
	af.modifier = -3;
	affect_to_char(ch, &af);

	af.aftype = AFT_INVIS;
	af.location = 0;
	af.where = TO_RESIST;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, RES_COLD);
	affect_to_char(ch, &af);
}